

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O2

void __thiscall SigNetParams::SigNetParams(SigNetParams *this,SigNetOptions *options)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  uint256 *puVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v;
  CBlock *this_01;
  long lVar2;
  pointer puVar3;
  string_view source_file;
  base_blob<256U> *pbVar4;
  bool bVar5;
  Logger *pLVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  CAmount *in_R9;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  string_view str;
  string_view logging_function;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bin;
  string log_msg;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_138;
  HashWriter h;
  string local_a8;
  allocator_type local_88 [32];
  value_type_conflict local_68 [32];
  uint256 hash;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(&this->super_CChainParams);
  bin.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bin.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bin.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_CChainParams).vSeeds;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  if ((options->challenge).
      super__Optional_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>.
      _M_engaged == false) {
    util::hex_literals::
    operator___hex_v_u8<util::hex_literals::detail::Hex<143UL>___81,_33,_3,_173,_94,_14,_218,_209,_140,_177,_______>
              ();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&bin,&log_msg);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&log_msg);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[34]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [34])"seed.signet.bitcoin.sprovoost.nl.");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[28]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [28])"seed.signet.achownodes.xyz.");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[16]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [16])"178.128.221.177");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[69]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [69])"v7ajjeirttkbnt32wpy3c6w3emwnfr3fkla7hpxcfokr3ysd3kqtzmqd.onion:38333"
              );
    puVar1 = &(this->super_CChainParams).consensus.nMinimumChainWork;
    (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0x8f;
    (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xe5;
    (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 'f';
    (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xbd;
    pbVar4 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[4] = ']';
    (pbVar4->m_data)._M_elems[5] = '\x02';
    pbVar4 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[6] = '\0';
    (pbVar4->m_data)._M_elems[7] = '\0';
    (pbVar4->m_data)._M_elems[8] = '\0';
    (pbVar4->m_data)._M_elems[9] = '\0';
    (pbVar4->m_data)._M_elems[10] = '\0';
    (pbVar4->m_data)._M_elems[0xb] = '\0';
    (pbVar4->m_data)._M_elems[0xc] = '\0';
    (pbVar4->m_data)._M_elems[0xd] = '\0';
    pbVar4 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0xe] = '\0';
    (pbVar4->m_data)._M_elems[0xf] = '\0';
    (pbVar4->m_data)._M_elems[0x10] = '\0';
    (pbVar4->m_data)._M_elems[0x11] = '\0';
    (pbVar4->m_data)._M_elems[0x12] = '\0';
    (pbVar4->m_data)._M_elems[0x13] = '\0';
    (pbVar4->m_data)._M_elems[0x14] = '\0';
    (pbVar4->m_data)._M_elems[0x15] = '\0';
    pbVar4 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x10] = '\0';
    (pbVar4->m_data)._M_elems[0x11] = '\0';
    (pbVar4->m_data)._M_elems[0x12] = '\0';
    (pbVar4->m_data)._M_elems[0x13] = '\0';
    (pbVar4->m_data)._M_elems[0x14] = '\0';
    (pbVar4->m_data)._M_elems[0x15] = '\0';
    (pbVar4->m_data)._M_elems[0x16] = '\0';
    (pbVar4->m_data)._M_elems[0x17] = '\0';
    pbVar4 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x18] = '\0';
    (pbVar4->m_data)._M_elems[0x19] = '\0';
    (pbVar4->m_data)._M_elems[0x1a] = '\0';
    (pbVar4->m_data)._M_elems[0x1b] = '\0';
    (pbVar4->m_data)._M_elems[0x1c] = '\0';
    (pbVar4->m_data)._M_elems[0x1d] = '\0';
    (pbVar4->m_data)._M_elems[0x1e] = '\0';
    (pbVar4->m_data)._M_elems[0x1f] = '\0';
    puVar1 = &(this->super_CChainParams).consensus.defaultAssumeValid;
    (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '9';
    (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 'E';
    (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 'A';
    (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0x8d;
    (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 0xe6;
    (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 0xef;
    (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 0xa2;
    (puVar1->super_base_blob<256U>).m_data._M_elems[7] = 's';
    pbVar4 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[8] = 0xf5;
    (pbVar4->m_data)._M_elems[9] = '\"';
    (pbVar4->m_data)._M_elems[10] = 'k';
    (pbVar4->m_data)._M_elems[0xb] = 'q';
    (pbVar4->m_data)._M_elems[0xc] = 'n';
    (pbVar4->m_data)._M_elems[0xd] = '0';
    (pbVar4->m_data)._M_elems[0xe] = 0xc6;
    (pbVar4->m_data)._M_elems[0xf] = 't';
    pbVar4 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x10] = '3';
    (pbVar4->m_data)._M_elems[0x11] = '\a';
    (pbVar4->m_data)._M_elems[0x12] = 0x9b;
    (pbVar4->m_data)._M_elems[0x13] = 't';
    (pbVar4->m_data)._M_elems[0x14] = 0xdd;
    (pbVar4->m_data)._M_elems[0x15] = 'd';
    (pbVar4->m_data)._M_elems[0x16] = 0xb9;
    (pbVar4->m_data)._M_elems[0x17] = 0xdc;
    pbVar4 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x18] = 0xdd;
    (pbVar4->m_data)._M_elems[0x19] = 'X';
    (pbVar4->m_data)._M_elems[0x1a] = '\x1d';
    (pbVar4->m_data)._M_elems[0x1b] = 0xad;
    (pbVar4->m_data)._M_elems[0x1c] = 'J';
    (pbVar4->m_data)._M_elems[0x1d] = '\x01';
    (pbVar4->m_data)._M_elems[0x1e] = '\0';
    (pbVar4->m_data)._M_elems[0x1f] = '\0';
    (this->super_CChainParams).m_assumed_blockchain_size = 2;
    (this->super_CChainParams).m_assumed_chain_state_size = 0;
    (this->super_CChainParams).chainTxData.nTime = 0x66bce441;
    (this->super_CChainParams).chainTxData.tx_count = 0x5407e5;
    (this->super_CChainParams).chainTxData.dTxRate = 0.06271073277261494;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&bin,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)options);
    pbVar4 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x10] = '\0';
    (pbVar4->m_data)._M_elems[0x11] = '\0';
    (pbVar4->m_data)._M_elems[0x12] = '\0';
    (pbVar4->m_data)._M_elems[0x13] = '\0';
    (pbVar4->m_data)._M_elems[0x14] = '\0';
    (pbVar4->m_data)._M_elems[0x15] = '\0';
    (pbVar4->m_data)._M_elems[0x16] = '\0';
    (pbVar4->m_data)._M_elems[0x17] = '\0';
    pbVar4 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x18] = '\0';
    (pbVar4->m_data)._M_elems[0x19] = '\0';
    (pbVar4->m_data)._M_elems[0x1a] = '\0';
    (pbVar4->m_data)._M_elems[0x1b] = '\0';
    (pbVar4->m_data)._M_elems[0x1c] = '\0';
    (pbVar4->m_data)._M_elems[0x1d] = '\0';
    (pbVar4->m_data)._M_elems[0x1e] = '\0';
    (pbVar4->m_data)._M_elems[0x1f] = '\0';
    puVar1 = &(this->super_CChainParams).consensus.nMinimumChainWork;
    (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
    pbVar4 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[8] = '\0';
    (pbVar4->m_data)._M_elems[9] = '\0';
    (pbVar4->m_data)._M_elems[10] = '\0';
    (pbVar4->m_data)._M_elems[0xb] = '\0';
    (pbVar4->m_data)._M_elems[0xc] = '\0';
    (pbVar4->m_data)._M_elems[0xd] = '\0';
    (pbVar4->m_data)._M_elems[0xe] = '\0';
    (pbVar4->m_data)._M_elems[0xf] = '\0';
    puVar1 = &(this->super_CChainParams).consensus.defaultAssumeValid;
    (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
    (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
    pbVar4 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[8] = '\0';
    (pbVar4->m_data)._M_elems[9] = '\0';
    (pbVar4->m_data)._M_elems[10] = '\0';
    (pbVar4->m_data)._M_elems[0xb] = '\0';
    (pbVar4->m_data)._M_elems[0xc] = '\0';
    (pbVar4->m_data)._M_elems[0xd] = '\0';
    (pbVar4->m_data)._M_elems[0xe] = '\0';
    (pbVar4->m_data)._M_elems[0xf] = '\0';
    pbVar4 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x10] = '\0';
    (pbVar4->m_data)._M_elems[0x11] = '\0';
    (pbVar4->m_data)._M_elems[0x12] = '\0';
    (pbVar4->m_data)._M_elems[0x13] = '\0';
    (pbVar4->m_data)._M_elems[0x14] = '\0';
    (pbVar4->m_data)._M_elems[0x15] = '\0';
    (pbVar4->m_data)._M_elems[0x16] = '\0';
    (pbVar4->m_data)._M_elems[0x17] = '\0';
    pbVar4 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x18] = '\0';
    (pbVar4->m_data)._M_elems[0x19] = '\0';
    (pbVar4->m_data)._M_elems[0x1a] = '\0';
    (pbVar4->m_data)._M_elems[0x1b] = '\0';
    (pbVar4->m_data)._M_elems[0x1c] = '\0';
    (pbVar4->m_data)._M_elems[0x1d] = '\0';
    (pbVar4->m_data)._M_elems[0x1e] = '\0';
    (pbVar4->m_data)._M_elems[0x1f] = '\0';
    (this->super_CChainParams).m_assumed_blockchain_size = 0;
    (this->super_CChainParams).m_assumed_chain_state_size = 0;
    (this->super_CChainParams).chainTxData.dTxRate = 0.0;
    (this->super_CChainParams).chainTxData.nTime = 0;
    (this->super_CChainParams).chainTxData.tx_count = 0;
    s.m_size = (long)bin.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)bin.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    s.m_data = bin.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_a8,s);
    pLVar6 = LogInstance();
    bVar5 = BCLog::Logger::Enabled(pLVar6);
    if (bVar5) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length._0_4_ = 0;
      log_msg._M_string_length._4_4_ = 0;
      log_msg.field_2._M_allocated_capacity._0_4_ =
           log_msg.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      tinyformat::format<std::__cxx11::string>
                ((string *)&h,(tinyformat *)"Signet with challenge %s\n",(char *)&local_a8,in_RCX);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h);
      std::__cxx11::string::~string((string *)&h);
      pLVar6 = LogInstance();
      str._M_len._4_4_ = log_msg._M_string_length._4_4_;
      str._M_len._0_4_ = (undefined4)log_msg._M_string_length;
      h.ctx.s[0] = 0x5f;
      h.ctx.s[1] = 0;
      h.ctx.s._8_8_ = anon_var_dwarf_1d75812;
      in_R9 = (CAmount *)0x1be;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
      ;
      source_file._M_len = 0x5f;
      str._M_str = log_msg._M_dataplus._M_p;
      logging_function._M_str = "SigNetParams";
      logging_function._M_len = 0xc;
      BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0x1be,ALL,Info);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((options->seeds).
      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_engaged == true) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&options->seeds);
  }
  (this->super_CChainParams).m_chain_type = SIGNET;
  (this->super_CChainParams).consensus.signet_blocks = true;
  v = &(this->super_CChainParams).consensus.signet_challenge;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)v,
             bin.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             bin.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  (this->super_CChainParams).consensus.nSubsidyHalvingInterval = 210000;
  (this->super_CChainParams).consensus.BIP34Height = 1;
  puVar1 = &(this->super_CChainParams).consensus.BIP34Hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar4 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  pbVar4 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  pbVar4 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.BIP65Height = 1;
  (this->super_CChainParams).consensus.BIP66Height = 1;
  (this->super_CChainParams).consensus.CSVHeight = 1;
  (this->super_CChainParams).consensus.SegwitHeight = 1;
  (this->super_CChainParams).consensus.nPowTargetTimespan = 0x127500;
  (this->super_CChainParams).consensus.nPowTargetSpacing = 600;
  puVar1 = &(this->super_CChainParams).consensus.powLimit;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar4 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  pbVar4 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  pbVar4 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  *(undefined8 *)
   ((this->super_CChainParams).consensus.powLimit.super_base_blob<256U>.m_data._M_elems + 0x1b) =
       0x377ae;
  (this->super_CChainParams).consensus.MinBIP9WarningHeight = 0;
  (this->super_CChainParams).consensus.nRuleChangeActivationThreshold = 0x717;
  (this->super_CChainParams).consensus.nMinerConfirmationWindow = 0x7e0;
  (this->super_CChainParams).consensus.vDeployments[0].bit = 0x1c;
  (this->super_CChainParams).consensus.vDeployments[0].nStartTime = -2;
  (this->super_CChainParams).consensus.vDeployments[0].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[0].min_activation_height = 0;
  (this->super_CChainParams).consensus.vDeployments[1].bit = 2;
  (this->super_CChainParams).consensus.vDeployments[1].nStartTime = -1;
  (this->super_CChainParams).consensus.vDeployments[1].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[1].min_activation_height = 0;
  h.ctx.buf[0x30] = '\0';
  h.ctx.buf[0x31] = '\0';
  h.ctx.buf[0x32] = '\0';
  h.ctx.buf[0x33] = '\0';
  h.ctx.buf[0x34] = '\0';
  h.ctx.buf[0x35] = '\0';
  h.ctx.buf[0x36] = '\0';
  h.ctx.buf[0x37] = '\0';
  h.ctx.buf[0x38] = '\0';
  h.ctx.buf[0x39] = '\0';
  h.ctx.buf[0x3a] = '\0';
  h.ctx.buf[0x3b] = '\0';
  h.ctx.buf[0x3c] = '\0';
  h.ctx.buf[0x3d] = '\0';
  h.ctx.buf[0x3e] = '\0';
  h.ctx.buf[0x3f] = '\0';
  h.ctx.buf[0x20] = '\0';
  h.ctx.buf[0x21] = '\0';
  h.ctx.buf[0x22] = '\0';
  h.ctx.buf[0x23] = '\0';
  h.ctx.buf[0x24] = '\0';
  h.ctx.buf[0x25] = '\0';
  h.ctx.buf[0x26] = '\0';
  h.ctx.buf[0x27] = '\0';
  h.ctx.buf[0x28] = '\0';
  h.ctx.buf[0x29] = '\0';
  h.ctx.buf[0x2a] = '\0';
  h.ctx.buf[0x2b] = '\0';
  h.ctx.buf[0x2c] = '\0';
  h.ctx.buf[0x2d] = '\0';
  h.ctx.buf[0x2e] = '\0';
  h.ctx.buf[0x2f] = '\0';
  h.ctx.buf[0x10] = '\0';
  h.ctx.buf[0x11] = '\0';
  h.ctx.buf[0x12] = '\0';
  h.ctx.buf[0x13] = '\0';
  h.ctx.buf[0x14] = '\0';
  h.ctx.buf[0x15] = '\0';
  h.ctx.buf[0x16] = '\0';
  h.ctx.buf[0x17] = '\0';
  h.ctx.buf[0x18] = '\0';
  h.ctx.buf[0x19] = '\0';
  h.ctx.buf[0x1a] = '\0';
  h.ctx.buf[0x1b] = '\0';
  h.ctx.buf[0x1c] = '\0';
  h.ctx.buf[0x1d] = '\0';
  h.ctx.buf[0x1e] = '\0';
  h.ctx.buf[0x1f] = '\0';
  h.ctx.buf[0] = '\0';
  h.ctx.buf[1] = '\0';
  h.ctx.buf[2] = '\0';
  h.ctx.buf[3] = '\0';
  h.ctx.buf[4] = '\0';
  h.ctx.buf[5] = '\0';
  h.ctx.buf[6] = '\0';
  h.ctx.buf[7] = '\0';
  h.ctx.buf[8] = '\0';
  h.ctx.buf[9] = '\0';
  h.ctx.buf[10] = '\0';
  h.ctx.buf[0xb] = '\0';
  h.ctx.buf[0xc] = '\0';
  h.ctx.buf[0xd] = '\0';
  h.ctx.buf[0xe] = '\0';
  h.ctx.buf[0xf] = '\0';
  h.ctx.s[4] = 0;
  h.ctx.s[5] = 0;
  h.ctx.s[6] = 0;
  h.ctx.s[7] = 0;
  h.ctx.s[0] = 0;
  h.ctx.s[1] = 0;
  h.ctx.s[2] = 0;
  h.ctx.s[3] = 0;
  h.ctx.bytes = 0;
  CSHA256::CSHA256(&h.ctx);
  Serialize<HashWriter,unsigned_char,std::allocator<unsigned_char>>(&h,v);
  HashWriter::GetHash(&hash,&h);
  *(undefined4 *)(this->super_CChainParams).pchMessageStart._M_elems =
       hash.super_base_blob<256U>.m_data._M_elems._0_4_;
  (this->super_CChainParams).nDefaultPort = 0x95bd;
  (this->super_CChainParams).nPruneAfterHeight = 1000;
  local_68[0] = '\0';
  local_68[1] = 0xf2;
  local_68[2] = '\x05';
  local_68[3] = '*';
  local_68[4] = '\x01';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  CreateGenesisBlock((CBlock *)&log_msg,0x5f4d8f00,0x322d28a,0x1e0377ae,(int32_t)local_68,in_R9);
  this_01 = &(this->super_CChainParams).genesis;
  CBlock::operator=(this_01,(CBlock *)&log_msg);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_138);
  CBlockHeader::GetHash((uint256 *)&log_msg,&this_01->super_CBlockHeader);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x10) =
       CONCAT44(log_msg.field_2._M_allocated_capacity._4_4_,
                log_msg.field_2._M_allocated_capacity._0_4_);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x18) = CONCAT44(log_msg.field_2._12_4_,log_msg.field_2._8_4_);
  *(pointer *)
   (this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems =
       log_msg._M_dataplus._M_p;
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 8) =
       CONCAT44(log_msg._M_string_length._4_4_,(undefined4)log_msg._M_string_length);
  log_msg._M_dataplus._M_p._0_4_ = 0x3bee1ef6;
  log_msg._M_dataplus._M_p._4_4_ = 0xa480a363;
  log_msg._M_string_length._0_4_ = 0xaf63a077;
  log_msg._M_string_length._4_4_ = 0xc9bbb232;
  log_msg.field_2._M_allocated_capacity._0_4_ = 0xf0f99f7c;
  log_msg.field_2._M_allocated_capacity._4_4_ = 0x25422c1f;
  log_msg.field_2._8_4_ = 0x819873e9;
  log_msg.field_2._12_4_ = 8;
  bVar5 = ::operator==((base_blob<256U> *)this,(base_blob<256U> *)&log_msg);
  if (!bVar5) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"00000008819873e925422c1ff0f99f7cc9bbb232af63a077a480a3633bee1ef6\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x1ee,"SigNetParams::SigNetParams(const SigNetOptions &)");
  }
  log_msg._M_dataplus._M_p._0_4_ = 0xfdeda33b;
  log_msg._M_dataplus._M_p._4_4_ = 0xb2127b7a;
  log_msg._M_string_length._0_4_ = 0x3e2cc77a;
  log_msg._M_string_length._4_4_ = 0x618f7667;
  log_msg.field_2._M_allocated_capacity._0_4_ = 0xc31bc87f;
  log_msg.field_2._M_allocated_capacity._4_4_ = 0x32518a88;
  log_msg.field_2._8_4_ = 0xaab89f3a;
  log_msg.field_2._12_4_ = 0x4a5e1e4b;
  bVar5 = ::operator==(&(this->super_CChainParams).genesis.super_CBlockHeader.hashMerkleRoot.
                        super_base_blob<256U>,(base_blob<256U> *)&log_msg);
  if (!bVar5) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x1ef,"SigNetParams::SigNetParams(const SigNetOptions &)");
  }
  puVar3 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).vFixedSeeds.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->super_CChainParams).vFixedSeeds.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  log_msg._M_dataplus._M_p._0_4_ = 160000;
  log_msg._M_dataplus._M_p._4_4_ = 0xdbdf928a;
  log_msg._M_string_length._0_4_ = 0xb7d70783;
  log_msg._M_string_length._4_4_ = 0x308c9b59;
  log_msg.field_2._M_allocated_capacity._0_4_ = 0x1bcccf0b;
  log_msg.field_2._M_allocated_capacity._4_4_ = 0xb419c622;
  log_msg.field_2._8_4_ = 0x883d246c;
  log_msg.field_2._12_4_ = 0x9b74d6b5;
  std::vector<AssumeutxoData,std::allocator<AssumeutxoData>>::_M_assign_aux<AssumeutxoData_const*>
            ((vector<AssumeutxoData,std::allocator<AssumeutxoData>> *)
             &(this->super_CChainParams).m_assumeutxo_data,&log_msg);
  local_68[0] = 'o';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&log_msg,1,local_68,local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes,&log_msg);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&log_msg);
  local_68[0] = 0xc4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&log_msg,1,local_68,local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 1,&log_msg);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&log_msg);
  local_68[0] = 0xef;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&log_msg,1,local_68,local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 2,&log_msg);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&log_msg);
  log_msg._M_dataplus._M_p._0_4_ = 0xcf873504;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 3),&log_msg,
             (undefined1 *)((long)&log_msg._M_dataplus._M_p + 4));
  log_msg._M_dataplus._M_p._0_4_ = 0x94833504;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 4),&log_msg);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&(this->super_CChainParams).bech32_hrp,"tb");
  (this->super_CChainParams).fDefaultConsistencyChecks = false;
  (this->super_CChainParams).m_is_mockable_chain = false;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bin.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit SigNetParams(const SigNetOptions& options)
    {
        std::vector<uint8_t> bin;
        vSeeds.clear();

        if (!options.challenge) {
            bin = "512103ad5e0edad18cb1f0fc0d28a3d4f1f3e445640337489abb10404f2d1e086be430210359ef5021964fe22d6f8e05b2463c9540ce96883fe3b278760f048f5189f2e6c452ae"_hex_v_u8;
            vSeeds.emplace_back("seed.signet.bitcoin.sprovoost.nl.");
            vSeeds.emplace_back("seed.signet.achownodes.xyz."); // Ava Chow, only supports x1, x5, x9, x49, x809, x849, xd, x400, x404, x408, x448, xc08, xc48, x40c

            // Hardcoded nodes can be removed once there are more DNS seeds
            vSeeds.emplace_back("178.128.221.177");
            vSeeds.emplace_back("v7ajjeirttkbnt32wpy3c6w3emwnfr3fkla7hpxcfokr3ysd3kqtzmqd.onion:38333");

            consensus.nMinimumChainWork = uint256{"0000000000000000000000000000000000000000000000000000025dbd66e58f"};
            consensus.defaultAssumeValid = uint256{"0000014aad1d58dddcb964dd749b073374c6306e716b22f573a2efe68d414539"}; // 208800
            m_assumed_blockchain_size = 2;
            m_assumed_chain_state_size = 0;
            chainTxData = ChainTxData{
                // Data from RPC: getchaintxstats 4096 0000014aad1d58dddcb964dd749b073374c6306e716b22f573a2efe68d414539
                .nTime    = 1723655233,
                .tx_count = 5507045,
                .dTxRate  = 0.06271073277261494,
            };
        } else {
            bin = *options.challenge;
            consensus.nMinimumChainWork = uint256{};
            consensus.defaultAssumeValid = uint256{};
            m_assumed_blockchain_size = 0;
            m_assumed_chain_state_size = 0;
            chainTxData = ChainTxData{
                0,
                0,
                0,
            };
            LogPrintf("Signet with challenge %s\n", HexStr(bin));
        }

        if (options.seeds) {
            vSeeds = *options.seeds;
        }

        m_chain_type = ChainType::SIGNET;
        consensus.signet_blocks = true;
        consensus.signet_challenge.assign(bin.begin(), bin.end());
        consensus.nSubsidyHalvingInterval = 210000;
        consensus.BIP34Height = 1;
        consensus.BIP34Hash = uint256{};
        consensus.BIP65Height = 1;
        consensus.BIP66Height = 1;
        consensus.CSVHeight = 1;
        consensus.SegwitHeight = 1;
        consensus.nPowTargetTimespan = 14 * 24 * 60 * 60; // two weeks
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = false;
        consensus.enforce_BIP94 = false;
        consensus.fPowNoRetargeting = false;
        consensus.nRuleChangeActivationThreshold = 1815; // 90% of 2016
        consensus.nMinerConfirmationWindow = 2016; // nPowTargetTimespan / nPowTargetSpacing
        consensus.MinBIP9WarningHeight = 0;
        consensus.powLimit = uint256{"00000377ae000000000000000000000000000000000000000000000000000000"};
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = Consensus::BIP9Deployment::NEVER_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        // Activation of Taproot (BIPs 340-342)
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = Consensus::BIP9Deployment::ALWAYS_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 0; // No activation delay

        // message start is defined as the first 4 bytes of the sha256d of the block script
        HashWriter h{};
        h << consensus.signet_challenge;
        uint256 hash = h.GetHash();
        std::copy_n(hash.begin(), 4, pchMessageStart.begin());

        nDefaultPort = 38333;
        nPruneAfterHeight = 1000;

        genesis = CreateGenesisBlock(1598918400, 52613770, 0x1e0377ae, 1, 50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"00000008819873e925422c1ff0f99f7cc9bbb232af63a077a480a3633bee1ef6"});
        assert(genesis.hashMerkleRoot == uint256{"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b"});

        vFixedSeeds.clear();

        m_assumeutxo_data = {
            {
                .height = 160'000,
                .hash_serialized = AssumeutxoHash{uint256{"fe0a44309b74d6b5883d246cb419c6221bcccf0b308c9b59b7d70783dbdf928a"}},
                .m_chain_tx_count = 2289496,
                .blockhash = consteval_ctor(uint256{"0000003ca3c99aff040f2563c2ad8f8ec88bd0fd6b8f0895cfaf1ef90353a62c"}),
            }
        };

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,111);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,196);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,239);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x35, 0x87, 0xCF};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x35, 0x83, 0x94};

        bech32_hrp = "tb";

        fDefaultConsistencyChecks = false;
        m_is_mockable_chain = false;
    }